

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<long_double>::TPZSkylMatrix(TPZSkylMatrix<long_double> *this,int64_t dim)

{
  longdouble *local_18;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = dim;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = dim;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSkylMatrix_0187af40;
  TPZVec<long_double_*>::TPZVec(&this->fElem,dim + 1);
  TPZVec<long_double>::TPZVec(&this->fStorage,0);
  local_18 = (longdouble *)0x0;
  TPZVec<long_double_*>::Fill(&this->fElem,&local_18,0,-1);
  return;
}

Assistant:

TPZSkylMatrix<TVar>::TPZSkylMatrix(const int64_t dim )
: TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>( dim, dim ), fElem(dim+1), fStorage(0)
{
	
	// Inicializa a diagonal (vazia).
	fElem.Fill(0);
}